

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
::fulfill(Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
          *this,FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *value)

{
  ExceptionOr<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  local_1e8;
  
  if ((this->super_CoroutineBase).waiting != true) {
    return;
  }
  local_1e8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1e8.value.ptr.isSet = true;
  local_1e8.value.ptr.field_1.value.tag = value->tag;
  if (local_1e8.value.ptr.field_1.value.tag == 3) {
    local_1e8.value.ptr.field_1._56_8_ = *(undefined8 *)((long)&value->field_1 + 0x30);
    local_1e8.value.ptr.field_1._8_4_ = *(undefined4 *)&value->field_1;
    local_1e8.value.ptr.field_1._12_4_ = *(undefined4 *)((long)&value->field_1 + 4);
    local_1e8.value.ptr.field_1._16_4_ = *(undefined4 *)((long)&value->field_1 + 8);
    local_1e8.value.ptr.field_1._20_4_ = *(undefined4 *)((long)&value->field_1 + 0xc);
    local_1e8.value.ptr.field_1._24_8_ = *(undefined8 *)((long)&value->field_1 + 0x10);
    local_1e8.value.ptr.field_1._32_8_ = *(undefined8 *)((long)&value->field_1 + 0x18);
    local_1e8.value.ptr.field_1._40_8_ = *(undefined8 *)((long)&value->field_1 + 0x20);
    local_1e8.value.ptr.field_1._48_8_ = *(undefined8 *)((long)&value->field_1 + 0x28);
  }
  else {
    if (local_1e8.value.ptr.field_1.value.tag != 2) {
      if (local_1e8.value.ptr.field_1.value.tag != 1) goto LAB_004542c7;
      local_1e8.value.ptr.field_1._24_8_ = *(undefined8 *)((long)&value->field_1 + 0x10);
    }
    local_1e8.value.ptr.field_1._8_4_ = *(undefined4 *)&value->field_1;
    local_1e8.value.ptr.field_1._12_4_ = *(undefined4 *)((long)&value->field_1 + 4);
    local_1e8.value.ptr.field_1._16_4_ = *(undefined4 *)((long)&value->field_1 + 8);
    local_1e8.value.ptr.field_1._20_4_ = *(undefined4 *)((long)&value->field_1 + 0xc);
  }
LAB_004542c7:
  ExceptionOr<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  ::operator=(&this->result,&local_1e8);
  if (local_1e8.value.ptr.isSet == true) {
    if (local_1e8.value.ptr.field_1.value.tag == 1) {
      local_1e8.value.ptr.field_1.value.tag = 0;
    }
    if (local_1e8.value.ptr.field_1.value.tag == 2) {
      local_1e8.value.ptr.field_1.value.tag = 0;
    }
    if (local_1e8.value.ptr.field_1.value.tag == 3) {
      local_1e8.value.ptr.field_1.value.tag = 0;
    }
  }
  if (local_1e8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1e8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  PromiseNode::OnReadyEvent::arm(&(this->super_CoroutineBase).onReadyEvent);
  (this->super_CoroutineBase).waiting = false;
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }